

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPrT.cpp
# Opt level: O2

void __thiscall OpenMD::NPrT::evolveEtaB(NPrT *this)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Mat3x3d hmat;
  Mat3x3d local_50;
  
  Snapshot::getHmat(&local_50,(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap
                   );
  dVar7 = *(double *)
           ((long)local_50.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
           (ulong)this->axis1_ * 0x20);
  dVar8 = *(double *)
           ((long)local_50.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
           (ulong)this->axis2_ * 0x20);
  dVar6 = *(double *)
           ((long)local_50.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
           (ulong)this->axis_ * 0x20);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)&this->prevEta_,(RectMatrix<double,_3U,_3U> *)&this->eta)
  ;
  dVar6 = -dVar6;
  uVar3 = (ulong)this->axis1_;
  dVar5 = (this->super_NPT).targetPressure / 163882576.0;
  uVar4 = (ulong)this->axis2_;
  dVar1 = *(double *)
           ((long)(this->super_NPT).press.super_SquareMatrix<double,_3>.
                  super_RectMatrix<double,_3U,_3U>.data_ + uVar4 * 0x20);
  dVar2 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2;
  dVar8 = dVar7 * dVar8 * dVar2;
  dVar7 = (this->super_NPT).NkBT * (this->super_NPT).tb2;
  *(double *)
   ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
   uVar3 * 0x20) =
       *(double *)
        ((long)(this->oldEta_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
        + uVar3 * 0x20) -
       (((*(double *)
           ((long)(this->super_NPT).press.super_SquareMatrix<double,_3>.
                  super_RectMatrix<double,_3U,_3U>.data_ + uVar3 * 0x20) - dVar5) * dVar6 -
        this->surfaceTension_) * dVar8) / dVar7;
  *(double *)
   ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
   uVar4 * 0x20) =
       *(double *)
        ((long)(this->oldEta_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
        + uVar4 * 0x20) - (((dVar1 - dVar5) * dVar6 - this->surfaceTension_) * dVar8) / dVar7;
  uVar3 = (ulong)this->axis_;
  *(double *)
   ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
   uVar3 * 0x20) =
       ((*(double *)
          ((long)(this->super_NPT).press.super_SquareMatrix<double,_3>.
                 super_RectMatrix<double,_3U,_3U>.data_ + uVar3 * 0x20) - dVar5) *
       dVar2 * (this->super_NPT).instaVol) / dVar7 +
       *(double *)
        ((long)(this->oldEta_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
        + uVar3 * 0x20);
  return;
}

Assistant:

void NPrT::evolveEtaB() {
    Mat3x3d hmat        = snap->getHmat();
    RealType hz         = hmat(axis_, axis_);
    RealType Axy        = hmat(axis1_, axis1_) * hmat(axis2_, axis2_);
    prevEta_            = eta;
    RealType sx         = -hz * (press(axis1_, axis1_) -
                         targetPressure / Constants::pressureConvert);
    RealType sy         = -hz * (press(axis2_, axis2_) -
                         targetPressure / Constants::pressureConvert);
    eta(axis1_, axis1_) = oldEta_(axis1_, axis1_) -
                          dt2 * Axy * (sx - surfaceTension_) / (NkBT * tb2);
    eta(axis2_, axis2_) = oldEta_(axis2_, axis2_) -
                          dt2 * Axy * (sy - surfaceTension_) / (NkBT * tb2);
    eta(axis_, axis_) = oldEta_(axis_, axis_) +
                        dt2 * instaVol *
                            (press(axis_, axis_) -
                             targetPressure / Constants::pressureConvert) /
                            (NkBT * tb2);
  }